

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfConvert.cpp
# Opt level: O1

half Imf_3_4::floatToHalf(float f)

{
  char cVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  
  if ((0x7f7fffff < (uint)ABS(f)) ||
     ((uVar2 = 0x7c00,
      f < *(float *)(_imath_half_to_float_table + 0x1effc) ||
      f == *(float *)(_imath_half_to_float_table + 0x1effc) &&
      (uVar2 = 0xfc00, *(float *)(_imath_half_to_float_table + 0x3effc) <= f)))) {
    uVar3 = (uint)f & (uint)DAT_001b3490;
    uVar2 = (ushort)((uint)f >> 0x10) & 0x8000;
    if (uVar3 < 0x38800000) {
      if ((0x33000000 < uVar3) &&
         (uVar4 = uVar3 & 0x7fffff | 0x800000, cVar1 = (char)(uVar3 >> 0x17),
         uVar2 = uVar2 | (ushort)(uVar4 >> (0x7eU - cVar1 & 0x1f)),
         0x80000000 < uVar4 << (cVar1 + 0xa2U & 0x1f))) {
        return (half)(uVar2 + 1);
      }
    }
    else if (uVar3 < 0x7f800000) {
      if (0x477fefff < uVar3) {
        return (half)(uVar2 | 0x7c00);
      }
      uVar2 = (ushort)(uVar3 + 0x8000fff + (uint)((uVar3 >> 0xd & 1) != 0) >> 0xd) | uVar2;
    }
    else {
      uVar2 = uVar2 | 0x7c00;
      if (uVar3 != 0x7f800000) {
        uVar3 = uVar3 >> 0xd & 0x3ff;
        return (half)(uVar2 | (ushort)uVar3 | (ushort)(uVar3 == 0));
      }
    }
  }
  return (half)uVar2;
}

Assistant:

half
floatToHalf (float f)
{
    if (isFinite (f))
    {
        if (f > std::numeric_limits<half>::max ()) return half::posInf ();

        if (f < std::numeric_limits<half>::lowest ()) return half::negInf ();
    }

    return half (f);
}